

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupportTest_setDataFunctionPointer_Test::testBody
          (TEST_MockSupportTest_setDataFunctionPointer_Test *this)

{
  _func_void *p_Var1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  _func_void *p_Var4;
  TestTerminator *pTVar5;
  SimpleString local_b8;
  SimpleString local_a8;
  MockNamedValue local_98;
  SimpleString local_48 [2];
  SimpleString local_28;
  _func_void *local_18;
  _func_void *ptr;
  TEST_MockSupportTest_setDataFunctionPointer_Test *this_local;
  
  local_18 = (_func_void *)0x1;
  ptr = (_func_void *)this;
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"data");
  MockSupport::setData(pMVar2,local_48,local_18);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  pUVar3 = UtestShell::getCurrent();
  p_Var1 = local_18;
  SimpleString::SimpleString(&local_a8,"");
  pMVar2 = mock(&local_a8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"data");
  MockSupport::getData(&local_98,pMVar2,&local_b8);
  p_Var4 = MockNamedValue::getFunctionPointerValue(&local_98);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x14])
            (pUVar3,p_Var1,p_Var4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x80,pTVar5);
  MockNamedValue::~MockNamedValue(&local_98);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&local_a8);
  return;
}

Assistant:

TEST(MockSupportTest, setDataFunctionPointer)
{
    void (*ptr)() = (void(*)()) 0x001;
    mock().setData("data", ptr);
    FUNCTIONPOINTERS_EQUAL(ptr, mock().getData("data").getFunctionPointerValue());
}